

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberValidator.h
# Opt level: O2

string * __thiscall
cursespp::NumberValidator<int>::ErrorMessage_abi_cxx11_
          (string *__return_storage_ptr__,NumberValidator<int> *this)

{
  int iVar1;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  iVar1 = this->maximum;
  f8n::i18n::Locale::Instance();
  if (iVar1 == 0x7fffffff) {
    f8n::i18n::Locale::Translate_abi_cxx11_((char *)__return_storage_ptr__);
  }
  else {
    f8n::i18n::Locale::Translate_abi_cxx11_((char *)__return_storage_ptr__);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"{{minimum}}",&local_61);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
    ::operator()(&local_60,&this->formatter,this->minimum);
    f8n::str::replace(__return_storage_ptr__,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"{{maximum}}",&local_61);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
    ::operator()(&local_60,&this->formatter,this->maximum);
    f8n::str::replace(__return_storage_ptr__,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string ErrorMessage() const override {
            if (bounded(minimum, maximum)) {
                std::string result = _TSTR("validator_dialog_number_parse_bounded_error");
                f8n::str::replace(result, "{{minimum}}", formatter(minimum));
                f8n::str::replace(result, "{{maximum}}", formatter(maximum));
                return result;
            }
            return _TSTR("validator_dialog_number_parse_error");
        }